

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
kratos::Generator::wire_interface
          (Generator *this,shared_ptr<kratos::InterfaceRef> *inst1,
          shared_ptr<kratos::InterfaceRef> *inst2)

{
  InterfaceRef *this_00;
  bool bVar1;
  PortDirection PVar2;
  element_type *peVar3;
  UserException *pUVar4;
  Generator *pGVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>_>
  *this_01;
  string *format_str;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 local_3a8 [32];
  undefined1 local_388 [40];
  string local_360;
  Port *local_340;
  Var *v;
  type *port;
  type *port_name;
  undefined1 local_320 [8];
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>_>
  *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>_>
  *ports;
  string local_2f8;
  _Rb_tree_node_base local_2d8;
  _Rb_tree_node_base local_2b8;
  undefined1 local_291;
  string local_290;
  string local_270;
  string local_250;
  enable_shared_from_this<kratos::Generator> local_230 [2];
  enable_shared_from_this<kratos::Generator> local_210;
  element_type *local_200;
  InterfaceRef *child;
  InterfaceRef *parent;
  Generator *gen2;
  Generator *gen1;
  shared_ptr<kratos::InterfaceRef> *inst2_local;
  shared_ptr<kratos::InterfaceRef> *inst1_local;
  Generator *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1b8;
  _Rb_tree_node_base local_1a8;
  _Rb_tree_node_base *local_180;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  _Rb_tree_node_base *local_170;
  _Base_ptr local_168;
  __node_base local_160;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_158;
  basic_string_view<char> local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_110;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  string *local_100;
  char *local_f8;
  string *local_f0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_e8;
  basic_string_view<char> local_d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  string *local_98;
  char *local_90;
  string *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  _Rb_tree_node_base *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  _Rb_tree_node_base *local_60;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_48;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  _Rb_tree_node_base *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  gen1 = (Generator *)inst2;
  inst2_local = inst1;
  inst1_local = (shared_ptr<kratos::InterfaceRef> *)this;
  peVar3 = std::__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)inst1);
  gen2 = InterfaceRef::gen(peVar3);
  peVar3 = std::__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)gen1);
  parent = (InterfaceRef *)InterfaceRef::gen(peVar3);
  pGVar5 = gen2;
  child = (InterfaceRef *)0x0;
  local_200 = (element_type *)0x0;
  std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_210);
  bVar1 = has_child_generator(pGVar5,(shared_ptr<kratos::Generator> *)&local_210);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_210);
  this_00 = parent;
  if (bVar1) {
    child = std::__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>::get
                      (&inst2_local->
                        super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>);
    local_200 = std::__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2> *)gen1);
  }
  else {
    std::enable_shared_from_this<kratos::Generator>::shared_from_this(local_230);
    bVar1 = has_child_generator((Generator *)this_00,(shared_ptr<kratos::Generator> *)local_230);
    std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)local_230);
    if (!bVar1) {
      local_291 = 1;
      pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
      handle_name_abi_cxx11_(&local_270,(Generator *)parent);
      handle_name_abi_cxx11_(&local_290,gen2);
      local_f0 = &local_250;
      local_f8 = "{0} is not a child of {1} or vise visa";
      local_100 = &local_270;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_290;
      fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[39],char>
                (&local_138,(v7 *)"{0} is not a child of {1} or vise visa",(char (*) [39])local_100,
                 (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
      local_110 = &local_138;
      local_148 = fmt::v7::to_string_view<char,_0>(local_f8);
      local_78 = &local_158;
      local_80 = local_110;
      local_50 = local_110;
      local_40 = local_110;
      local_48 = local_78;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_78,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_110);
      format_str_00.size_ = local_158.desc_;
      format_str_00.data_ = (char *)local_148.size_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_158.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_250,(detail *)local_148.data_,format_str_00,args);
      UserException::UserException(pUVar4,&local_250);
      local_291 = 0;
      __cxa_throw(pUVar4,&UserException::typeinfo,UserException::~UserException);
    }
    child = std::__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2> *)gen1);
    local_200 = std::__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>::get
                          (&inst2_local->
                            super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>);
  }
  pGVar5 = InterfaceRef::gen(child);
  if (pGVar5 == this) {
    this_01 = InterfaceRef::ports_abi_cxx11_(local_200);
    __end1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>_>
             ::begin(this_01);
    local_320 = (undefined1  [8])
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>_>
                ::end(this_01);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end1.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_true>
                         ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_true>
                           *)local_320);
      if (!bVar1) {
        return;
      }
      port_name = &std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_false,_true>
                   ::operator*(&__end1)->first;
      port = (type *)std::get<0ul,std::__cxx11::string_const,kratos::Port*>
                               ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>
                                 *)port_name);
      v = (Var *)std::get<1ul,std::__cxx11::string_const,kratos::Port*>
                           ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>
                             *)port_name);
      local_340 = (Port *)0x0;
      bVar1 = InterfaceRef::has_var(child,(string *)port);
      if (bVar1) {
        local_340 = (Port *)InterfaceRef::var(child,(string *)port);
      }
      else {
        bVar1 = InterfaceRef::has_port(child,(string *)port);
        if (bVar1) {
          local_340 = InterfaceRef::port(child,(string *)port);
        }
      }
      if (local_340 == (Port *)0x0) break;
      PVar2 = Port::port_direction((Port *)(v->super_IRNode)._vptr_IRNode);
      if (PVar2 == In) {
        Var::assign((Var *)local_388,(Var *)(v->super_IRNode)._vptr_IRNode);
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                  ((shared_ptr<kratos::Stmt> *)(local_388 + 0x10),
                   (shared_ptr<kratos::AssignStmt> *)local_388);
        add_stmt(this,(shared_ptr<kratos::Stmt> *)(local_388 + 0x10));
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_388 + 0x10));
        std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                  ((shared_ptr<kratos::AssignStmt> *)local_388);
      }
      else {
        Var::assign((Var *)local_3a8,&local_340->super_Var);
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                  ((shared_ptr<kratos::Stmt> *)(local_3a8 + 0x10),
                   (shared_ptr<kratos::AssignStmt> *)local_3a8);
        add_stmt(this,(shared_ptr<kratos::Stmt> *)(local_3a8 + 0x10));
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_3a8 + 0x10));
        std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                  ((shared_ptr<kratos::AssignStmt> *)local_3a8);
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_false,_true>
      ::operator++(&__end1);
    }
    local_388[0x27] = '\x01';
    pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
    peVar3 = std::
             __shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)inst2_local);
    format_str = InterfaceRef::name_abi_cxx11_(peVar3);
    peVar3 = std::
             __shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)gen1);
    vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)InterfaceRef::name_abi_cxx11_(peVar3);
    local_88 = &local_360;
    local_90 = "Unable to wire interface {0} with {1}";
    local_98 = format_str;
    fmt::v7::
    make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[38],char>
              (&local_c8,(v7 *)"Unable to wire interface {0} with {1}",(char (*) [38])format_str,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_2,in_R8);
    local_a8 = &local_c8;
    local_d8 = fmt::v7::to_string_view<char,_0>(local_90);
    local_28 = &local_e8;
    local_30 = local_a8;
    local_20 = local_a8;
    local_10 = local_a8;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_a8);
    format_str_02.size_ = local_e8.desc_;
    format_str_02.data_ = (char *)local_d8.size_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_e8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_360,(detail *)local_d8.data_,format_str_02,args_01);
    UserException::UserException(pUVar4,&local_360);
    local_388[0x27] = '\0';
    __cxa_throw(pUVar4,&UserException::typeinfo,UserException::~UserException);
  }
  pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
  handle_name_abi_cxx11_((string *)&local_2d8,(Generator *)parent);
  handle_name_abi_cxx11_(&local_2f8,gen2);
  local_160._M_nxt = (_Hash_node_base *)&local_2b8;
  local_168 = (_Base_ptr)0x431a74;
  local_170 = &local_2d8;
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_2f8;
  fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[39],char>
            ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1a8,(v7 *)"{0} is not a child of {1} or vise visa",(char (*) [39])local_170,
             (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_1,in_R8);
  local_180 = &local_1a8;
  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
               )fmt::v7::to_string_view<char,_0>((char *)local_168);
  local_68 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_70 = local_180;
  local_60 = local_180;
  local_38 = local_180;
  local_58 = local_68;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_68,0xdd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_180);
  format_str_01.size_ = (size_t)this_local;
  format_str_01.data_ = (char *)local_1b8._8_8_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_1c0.values_;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)&local_2b8,(detail *)local_1b8._M_allocated_capacity,format_str_01,args_00);
  UserException::UserException(pUVar4,(string *)&local_2b8);
  __cxa_throw(pUVar4,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

void Generator::wire_interface(const std::shared_ptr<InterfaceRef> &inst1,
                               const std::shared_ptr<InterfaceRef> &inst2) {
    // the orientation is determined by the generator reference from the interface instance
    auto *gen1 = inst1->gen();
    auto *gen2 = inst2->gen();
    InterfaceRef *parent = nullptr;
    InterfaceRef *child = nullptr;
    if (gen1->has_child_generator(gen2->shared_from_this())) {
        // gen2 is gen1's child
        // wiring gen2's ports to gen1's
        parent = inst1.get();
        child = inst2.get();
    } else if (gen2->has_child_generator(gen1->shared_from_this())) {
        parent = inst2.get();
        child = inst1.get();
    } else {
        throw UserException(::format("{0} is not a child of {1} or vise visa", gen2->handle_name(),
                                     gen1->handle_name()));
    }
    if (parent->gen() != this) {
        throw UserException(::format("{0} is not a child of {1} or vise visa", gen2->handle_name(),
                                     gen1->handle_name()));
    }

    auto const &ports = child->ports();
    for (auto const &[port_name, port] : ports) {
        Var *v = nullptr;
        if (parent->has_var(port_name)) {
            v = &parent->var(port_name);
        } else if (parent->has_port(port_name)) {
            v = &parent->port(port_name);
        }
        if (!v) {
            throw UserException(
                (::format("Unable to wire interface {0} with {1}", inst1->name(), inst2->name())));
        }
        if (port->port_direction() == PortDirection::In) {
            add_stmt(port->assign(*v));
        } else {
            add_stmt(v->assign(*port));
        }
    }
}